

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable_fwd.hpp
# Opt level: O0

bool __thiscall
boost::condition_variable::do_wait_for
          (condition_variable *this,unique_lock<boost::mutex> *lock,timespec *timeout)

{
  bool bVar1;
  timespec *in_RSI;
  timespec *in_RDI;
  timespec *in_stack_00000038;
  
  detail::timespec_now_realtime();
  detail::timespec_plus(in_RSI,in_RDI);
  bVar1 = do_wait_until((condition_variable *)lock,(unique_lock<boost::mutex> *)timeout,
                        in_stack_00000038);
  return bVar1;
}

Assistant:

bool do_wait_for(
            unique_lock<mutex>& lock,
            struct timespec const &timeout)
        {
#if defined BOOST_THREAD_HAS_CONDATTR_SET_CLOCK_MONOTONIC
            return do_wait_until(lock, boost::detail::timespec_plus(timeout, boost::detail::timespec_now_monotonic()));
#else
            // old behavior was fine for monotonic
            return do_wait_until(lock, boost::detail::timespec_plus(timeout, boost::detail::timespec_now_realtime()));
#endif
        }